

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

RsRuleSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::RsRuleSyntax,slang::syntax::RandJoinClauseSyntax*,slang::syntax::SyntaxList<slang::syntax::RsProdSyntax>&,slang::syntax::RsWeightClauseSyntax*>
          (BumpAllocator *this,RandJoinClauseSyntax **args,
          SyntaxList<slang::syntax::RsProdSyntax> *args_1,RsWeightClauseSyntax **args_2)

{
  RsRuleSyntax *pRVar1;
  size_t in_RDX;
  size_t in_RSI;
  RsWeightClauseSyntax *in_RDI;
  SyntaxList<slang::syntax::RsProdSyntax> *unaff_retaddr;
  
  pRVar1 = (RsRuleSyntax *)allocate((BumpAllocator *)in_RDI,in_RSI,in_RDX);
  slang::syntax::RsRuleSyntax::RsRuleSyntax
            ((RsRuleSyntax *)args_1,(RandJoinClauseSyntax *)args_2,unaff_retaddr,in_RDI);
  return pRVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }